

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugTools.h
# Opt level: O0

char * cm::(anonymous_namespace)::dbg_impl<char_const*>(char *fname,int line,char *expr,char *value)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_71;
  string local_70;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char *local_28;
  char *value_local;
  char *expr_local;
  char *pcStack_10;
  int line_local;
  char *fname_local;
  
  local_28 = value;
  value_local = expr;
  expr_local._4_4_ = line;
  pcStack_10 = fname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"CMAKE_NO_DBG",&local_71);
  cmSystemTools::GetEnvVar(&local_50,&local_70);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_50);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,pcStack_10);
    poVar2 = std::operator<<(poVar2,':');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,expr_local._4_4_);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,value_local);
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::operator<<(poVar2,local_28);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return local_28;
}

Assistant:

T dbg_impl(const char* fname, int line, const char* expr, T value)
{
  if (!cmSystemTools::GetEnvVar("CMAKE_NO_DBG")) {
    std::cerr << fname << ':' << line << ": " << expr << " = " << value
              << std::endl;
  }
  return value;
}